

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

target_ulong do_sdiv(CPUSPARCState_conflict1 *env,target_ulong a,target_ulong b,int cc,uintptr_t ra)

{
  int iVar1;
  ulong uVar2;
  target_ulong tStack_40;
  int32_t x1;
  int64_t x0;
  int overflow;
  uintptr_t ra_local;
  int cc_local;
  target_ulong b_local;
  target_ulong a_local;
  CPUSPARCState_conflict1 *env_local;
  
  x0._4_4_ = 0;
  uVar2 = a & 0xffffffff | env->y << 0x20;
  iVar1 = (int)b;
  if (iVar1 != 0) {
    if ((iVar1 == -1) && (uVar2 == 0x8000000000000000)) {
      tStack_40 = 0x7fffffff;
      x0._4_4_ = 1;
    }
    else {
      tStack_40 = (long)uVar2 / (long)iVar1;
      if ((long)(int)tStack_40 != tStack_40) {
        iVar1 = 0x7fffffff;
        if ((long)tStack_40 < 0) {
          iVar1 = -0x80000000;
        }
        tStack_40 = (target_ulong)iVar1;
        x0._4_4_ = 1;
      }
    }
    if (cc != 0) {
      env->cc_dst = tStack_40;
      env->cc_src2 = (long)x0._4_4_;
      env->cc_op = 2;
    }
    return tStack_40;
  }
  cpu_raise_exception_ra_sparc64(env,0x28,ra);
}

Assistant:

static target_ulong do_sdiv(CPUSPARCState *env, target_ulong a,
                            target_ulong b, int cc, uintptr_t ra)
{
    int overflow = 0;
    int64_t x0;
    int32_t x1;

    x0 = (a & 0xffffffff) | ((int64_t) (env->y) << 32);
    x1 = (b & 0xffffffff);

    if (x1 == 0) {
        cpu_raise_exception_ra(env, TT_DIV_ZERO, ra);
    } else if (x1 == -1 && x0 == INT64_MIN) {
        x0 = INT32_MAX;
        overflow = 1;
    } else {
        x0 = x0 / x1;
        if ((int32_t) x0 != x0) {
            x0 = x0 < 0 ? INT32_MIN : INT32_MAX;
            overflow = 1;
        }
    }

    if (cc) {
        env->cc_dst = x0;
        env->cc_src2 = overflow;
        env->cc_op = CC_OP_DIV;
    }
    return x0;
}